

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileParser::getMaterialDesc(ObjFileParser *this)

{
  bool bVar1;
  uint uVar2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var3;
  reference __beg;
  reference pcVar4;
  ulong uVar5;
  pointer pMVar6;
  Logger *this_00;
  Material *pMVar7;
  mapped_type *ppMVar8;
  reference ppVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  bool local_549;
  byte local_529;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  _Self local_4c8;
  _Self local_4c0;
  iterator it;
  string local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string strName;
  bool skip;
  char *pStart;
  ObjFileParser *this_local;
  
  _Var3 = getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current);
  (this->m_DataIt)._M_current = _Var3._M_current;
  bVar1 = __gnu_cxx::operator==(&this->m_DataIt,&this->m_DataItEnd);
  if (!bVar1) {
    __beg = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
            operator*(&this->m_DataIt);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&this->m_DataIt,&this->m_DataItEnd);
      local_529 = 0;
      if (bVar1) {
        pcVar4 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&this->m_DataIt);
        bVar1 = IsLineEnd<char>(*pcVar4);
        local_529 = bVar1 ^ 0xff;
      }
      if ((local_529 & 1) == 0) break;
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
                (&this->m_DataIt);
    }
    strName.field_2._M_local_buf[0xf] = '\0';
    pcVar4 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&this->m_DataIt);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char*,void>((string *)local_58,__beg,pcVar4,&local_59);
    std::allocator<char>::~allocator(&local_59);
    std::__cxx11::string::string(local_b0,(string *)local_58);
    trim_whitespaces<std::__cxx11::string>(&local_90,(Assimp *)local_b0,str);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string(local_b0);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      strName.field_2._M_local_buf[0xf] = '\x01';
    }
    pMVar6 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    local_549 = false;
    if (pMVar6->m_pCurrentMaterial != (Material *)0x0) {
      pMVar6 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      pMVar7 = pMVar6->m_pCurrentMaterial;
      aiString::aiString((aiString *)((long)&it._M_node + 4),(string *)local_58);
      local_549 = aiString::operator==(&pMVar7->MaterialName,(aiString *)((long)&it._M_node + 4));
    }
    if (local_549 != false) {
      strName.field_2._M_local_buf[0xf] = '\x01';
    }
    if ((strName.field_2._M_local_buf[0xf] & 1U) == 0) {
      pMVar6 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      local_4c0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
           ::find(&pMVar6->m_MaterialMap,(key_type *)local_58);
      pMVar6 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      local_4c8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
           ::end(&pMVar6->m_MaterialMap);
      bVar1 = std::operator==(&local_4c0,&local_4c8);
      if (bVar1) {
        this_00 = DefaultLogger::get();
        std::operator+(&local_508,"OBJ: failed to locate material ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
                      );
        std::operator+(&local_4e8,&local_508,", creating new material");
        Logger::error(this_00,&local_4e8);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_508);
        pMVar7 = (Material *)operator_new(0x409c);
        ObjFile::Material::Material(pMVar7);
        pMVar6 = std::
                 unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
                 operator->(&this->m_pModel);
        pMVar6->m_pCurrentMaterial = pMVar7;
        pMVar6 = std::
                 unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
                 operator->(&this->m_pModel);
        aiString::Set(&pMVar6->m_pCurrentMaterial->MaterialName,(string *)local_58);
        pMVar6 = std::
                 unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
                 operator->(&this->m_pModel);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pMVar6->m_MaterialLib,(value_type *)local_58);
        pMVar6 = std::
                 unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
                 operator->(&this->m_pModel);
        pMVar7 = pMVar6->m_pCurrentMaterial;
        pMVar6 = std::
                 unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
                 operator->(&this->m_pModel);
        ppMVar8 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
                  ::operator[](&pMVar6->m_MaterialMap,(key_type *)local_58);
        *ppMVar8 = pMVar7;
      }
      else {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>
                 ::operator*(&local_4c0);
        pMVar7 = ppVar9->second;
        pMVar6 = std::
                 unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
                 operator->(&this->m_pModel);
        pMVar6->m_pCurrentMaterial = pMVar7;
      }
      bVar1 = needsNewMesh(this,(string *)local_58);
      if (bVar1) {
        createMesh(this,(string *)local_58);
      }
      uVar2 = getMaterialIndex(this,(string *)local_58);
      pMVar6 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      pMVar6->m_pCurrentMesh->m_uiMaterialIndex = uVar2;
    }
    _Var3 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                      ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
    (this->m_DataIt)._M_current = _Var3._M_current;
    std::__cxx11::string::~string((string *)local_58);
  }
  return;
}

Assistant:

void ObjFileParser::getMaterialDesc() {
    // Get next data for material data
    m_DataIt = getNextToken<DataArrayIt>(m_DataIt, m_DataItEnd);
    if (m_DataIt == m_DataItEnd) {
        return;
    }

    char *pStart = &(*m_DataIt);
    while( m_DataIt != m_DataItEnd && !IsLineEnd( *m_DataIt ) ) {
        ++m_DataIt;
    }

    // In some cases we should ignore this 'usemtl' command, this variable helps us to do so
    bool skip = false;

    // Get name
    std::string strName(pStart, &(*m_DataIt));
    strName = trim_whitespaces(strName);
    if (strName.empty())
        skip = true;

    // If the current mesh has the same material, we simply ignore that 'usemtl' command
    // There is no need to create another object or even mesh here
    if ( m_pModel->m_pCurrentMaterial && m_pModel->m_pCurrentMaterial->MaterialName == aiString( strName ) ) {
        skip = true;
    }

    if (!skip) {
        // Search for material
        std::map<std::string, ObjFile::Material*>::iterator it = m_pModel->m_MaterialMap.find(strName);
        if (it == m_pModel->m_MaterialMap.end()) {
			// Not found, so we don't know anything about the material except for its name.
			// This may be the case if the material library is missing. We don't want to lose all
			// materials if that happens, so create a new named material instead of discarding it
			// completely.
            ASSIMP_LOG_ERROR("OBJ: failed to locate material " + strName + ", creating new material");
			m_pModel->m_pCurrentMaterial = new ObjFile::Material();
			m_pModel->m_pCurrentMaterial->MaterialName.Set(strName);
			m_pModel->m_MaterialLib.push_back(strName);
			m_pModel->m_MaterialMap[strName] = m_pModel->m_pCurrentMaterial;
        } else {
            // Found, using detected material
            m_pModel->m_pCurrentMaterial = (*it).second;
        }

        if ( needsNewMesh( strName ) ) {
            createMesh( strName );
        }

        m_pModel->m_pCurrentMesh->m_uiMaterialIndex = getMaterialIndex(strName);
    }

    // Skip rest of line
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}